

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
BpTree<float>::FindGreater
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          BpTree<float> *this,float k,bool EQ)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  Addr Cp;
  IndexNode<float> C;
  Addr local_a0;
  long local_98;
  IndexNode<float> local_90;
  
  IndexNode<float>::IndexNode(&local_90,this->N);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if ((this->RootAddr).FileOff != -1) {
    if (EQ) {
      iVar3 = FindFirstKey(this,k,&local_a0);
    }
    else {
      iVar3 = FindNextKey(this,k,&local_a0);
    }
    if (iVar3 != -1) {
      FindNode(this,local_a0,&local_90);
      do {
        lVar8 = (long)iVar3;
        local_98 = lVar8 * 8;
        do {
          uVar4 = this->N - 1;
          uVar6 = (ulong)uVar4;
          iVar7 = iVar3;
          if (iVar3 < (int)uVar4) {
            cVar2 = local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar8];
            lVar9 = lVar8;
            lVar10 = local_98;
            while (cVar2 == '1') {
              lVar9 = lVar9 + 1;
              std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
              _M_insert_unique<Addr_const&>
                        ((_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>
                          *)__return_storage_ptr__,
                         (Addr *)((long)&(local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->BlockNum +
                                 lVar10));
              iVar7 = (int)lVar9;
              uVar6 = (long)this->N - 1;
              if ((long)uVar6 <= lVar9) break;
              lVar10 = lVar10 + 8;
              cVar2 = local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar9];
            }
          }
          iVar5 = (int)uVar6;
          if (iVar7 == iVar5) {
            if (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                super__Vector_impl_data._M_start[iVar7].FileOff != -1) goto LAB_0012a2fd;
            goto LAB_0012a31f;
          }
        } while (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar7] != '0');
        if (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
            super__Vector_impl_data._M_start[iVar5].FileOff == -1) goto LAB_0012a31f;
LAB_0012a2fd:
        iVar3 = 0;
        FindNode(this,local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar5],&local_90);
      } while( true );
    }
    std::_Rb_tree<Addr,_Addr,_std::_Identity<Addr>,_std::less<Addr>,_std::allocator<Addr>_>::clear
              (&__return_storage_ptr__->_M_t);
  }
LAB_0012a31f:
  if (local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_90.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.k.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

set<Addr> BpTree<K>::FindGreater(K k, bool EQ) {
	IndexNode<K> C(N);
	set<Addr> ret;
	int i, pos;
	Addr Cp;
	if (this->RootAddr.FileOff == -1)
		return ret;
	if (EQ == false) {
		pos = this->FindNextKey(k, Cp);
	}
	else {
		pos = this->FindFirstKey(k, Cp);
	}
    if(pos == -1){
        ret.clear();
        return ret;
    }
	this->FindNode(Cp, C);
	while (1) {
		for (i = pos; i < N - 1 && C.v[i] == '1'; i++) {
			ret.insert(C.p[i]);
		}
		if ((i == N - 1 || C.v[i] == '0') && C.p[N - 1].FileOff == -1) {
			break;
		}
		else if (i == N - 1 || C.v[i] == '0') {
			pos = 0;
			this->FindNode(C.p[N - 1], C);
		}
	}
	return ret;
}